

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::Desugarer::makeObjectComprehension
          (Desugarer *this,ObjectComprehension *ast,uint obj_level)

{
  pointer pOVar1;
  pointer pCVar2;
  sockaddr *__addr;
  Identifier *pIVar3;
  AST *pAVar4;
  Index *pIVar5;
  ObjectComprehensionSimple *pOVar6;
  pointer pCVar7;
  LocationRange *args;
  initializer_list<jsonnet::internal::Array::Element> __l;
  bool local_339;
  uint local_338;
  int local_334;
  LiteralNumber *local_330;
  Var *local_328;
  Identifier *local_320;
  void *local_318;
  Local *local_310;
  Binds binds;
  AST *zero;
  Identifier *_arr;
  AST *value;
  Elements arr_e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  SuperVars svs;
  AST *arr;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_260 [16];
  Bind local_e0;
  
  local_338 = obj_level;
  if (obj_level == 0) {
    ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&arr,L"$",(allocator<char32_t> *)&local_e0);
    pIVar3 = id(this,(UString *)&arr);
    ::std::__cxx11::u32string::~u32string((u32string *)&arr);
    pAVar4 = &make<jsonnet::internal::Self,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                        (this,(LocationRange *)E,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF)->super_AST;
    ObjectField::Local((ObjectField *)&arr,(Fodder *)EF,(Fodder *)EF,pIVar3,(Fodder *)EF,pAVar4,
                       (Fodder *)EF);
    ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
    emplace_back<jsonnet::internal::ObjectField>(&ast->fields,(ObjectField *)&arr);
    ObjectField::~ObjectField((ObjectField *)&arr);
  }
  desugarFields(&svs,this,&ast->super_AST,&ast->fields,local_338);
  pOVar1 = (ast->fields).
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar4 = pOVar1->expr1;
  value = pOVar1->expr2;
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&arr,L"$arr",(allocator<char32_t> *)&local_e0);
  pIVar3 = id(this,(UString *)&arr);
  ::std::__cxx11::u32string::~u32string((u32string *)&arr);
  _arr = pIVar3;
  zero = &make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
                    (this,(LocationRange *)E,
                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                      *)EF,(char (*) [4])"0.0")->super_AST;
  binds.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binds.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  binds.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arr = pAVar4;
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::vector(local_260,
           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            *)EF);
  __l._M_len = 1;
  __l._M_array = (iterator)&arr;
  local_320 = pIVar3;
  ::std::
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>::
  vector(&arr_e,__l,(allocator_type *)&local_e0);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(local_260);
  pCVar2 = (ast->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_334 = 1;
  for (pCVar7 = (ast->specs).
                super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar7 != pCVar2; pCVar7 = pCVar7 + 1) {
    if (pCVar7->kind == FOR) {
      ::std::__cxx11::stringstream::stringstream((stringstream *)&arr);
      ::std::ostream::operator<<
                (&local_260[0].
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish,local_334);
      __addr = (sockaddr *)pCVar7->var;
      local_328 = var(this,local_320);
      local_339 = false;
      ::std::__cxx11::stringbuf::str();
      local_330 = make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::string>
                            (this,(LocationRange *)E,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_2a0);
      local_310 = (Local *)0x0;
      local_318 = (void *)0x0;
      pIVar5 = make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralNumber*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                         (this,(LocationRange *)E,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_328,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_339,&local_330,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_310,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_318,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF);
      bind((Desugarer *)&local_e0,(int)this,__addr,(socklen_t)pIVar5);
      ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ::emplace_back<jsonnet::internal::Local::Bind>(&binds,&local_e0);
      Local::Bind::~Bind(&local_e0);
      ::std::__cxx11::string::~string((string *)&local_2a0);
      local_e0.varFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)var(this,pCVar7->var);
      ::std::
      vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>::
      emplace_back<jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                ((vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
                  *)&arr_e,(Var **)&local_e0,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)EF);
      local_334 = local_334 + 1;
      ::std::__cxx11::stringstream::~stringstream((stringstream *)&arr);
    }
  }
  args = &(ast->super_AST).location;
  local_2a0._M_dataplus._M_p = local_2a0._M_dataplus._M_p & 0xffffffffffffff00;
  local_e0.varFodder.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)make<jsonnet::internal::Array,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                          (this,args,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,&arr_e,(bool *)&local_2a0,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF);
  local_328 = (Var *)((ulong)local_328 & 0xffffffffffffff00);
  arr = &make<jsonnet::internal::ArrayComprehension,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Array*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,std::vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                   (this,args,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)EF,(Array **)&local_e0,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)EF,(bool *)&local_328,&ast->specs,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)EF)->super_AST;
  pIVar3 = local_320;
  desugar(this,&arr,local_338);
  local_2a0._M_dataplus._M_p = (pointer)var(this,pIVar3);
  local_328 = (Var *)0x0;
  local_318 = (void *)((ulong)local_318 & 0xffffffffffffff00);
  local_330 = (LiteralNumber *)0x0;
  local_e0.varFodder.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                          (this,(LocationRange *)E,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,(Var **)&local_2a0,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,(bool *)&local_318,&zero,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,&local_328,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,&local_330,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF);
  local_310 = make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>&,jsonnet::internal::AST*&>
                        (this,args,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&binds,&value);
  pOVar6 = make<jsonnet::internal::ObjectComprehensionSimple,jsonnet::internal::LocationRange&,jsonnet::internal::Index*,jsonnet::internal::Local*,jsonnet::internal::Identifier_const*&,jsonnet::internal::AST*&>
                     (this,args,(Index **)&local_e0,&local_310,&_arr,&arr);
  ::std::
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>::
  ~vector(&arr_e);
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  ~vector(&binds);
  ::std::
  _Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
  ::~_Vector_base(&svs.
                   super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
                 );
  return &pOVar6->super_AST;
}

Assistant:

AST* makeObjectComprehension(ObjectComprehension *ast, unsigned obj_level) {
        // Hidden variable to allow outer/top binding.
        if (obj_level == 0) {
            const Identifier *hidden_var = id(U"$");
            auto *body = make<Self>(E, EF);
            ast->fields.push_back(ObjectField::Local(EF, EF, hidden_var, EF, body, EF));
        }

        SuperVars svs = desugarFields(ast, ast->fields, obj_level);

        AST *field = ast->fields.front().expr1;
        AST *value = ast->fields.front().expr2;

        /*  {
            [arr[0]]: local x = arr[1], y = arr[2], z = arr[3]; val_expr
            for arr in [ [key_expr, x, y, z] for ...  ]
            }
        */
        auto *_arr = id(U"$arr");
        AST *zero = make<LiteralNumber>(E, EF, "0.0");
        int counter = 1;
        Local::Binds binds;
        Array::Elements arr_e{Array::Element(field, EF)};
        for (ComprehensionSpec &spec : ast->specs) {
            if (spec.kind == ComprehensionSpec::FOR) {
                std::stringstream num;
                num << counter++;
                binds.push_back(bind(spec.var,
                                     make<Index>(E,
                                                 EF,
                                                 var(_arr),
                                                 EF,
                                                 false,
                                                 make<LiteralNumber>(E, EF, num.str()),
                                                 EF,
                                                 nullptr,
                                                 EF,
                                                 nullptr,
                                                 EF)));
                arr_e.emplace_back(var(spec.var), EF);
            }
        }
        AST *arr = make<ArrayComprehension>(ast->location,
                                            EF,
                                            make<Array>(ast->location, EF, arr_e, false, EF),
                                            EF,
                                            false,
                                            ast->specs,
                                            EF);
        desugar(arr, obj_level);
        return make<ObjectComprehensionSimple>(
            ast->location,
            make<Index>(E, EF, var(_arr), EF, false, zero, EF, nullptr, EF, nullptr, EF),
            make<Local>(ast->location, EF, binds, value),
            _arr,
            arr);
    }